

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O0

Expression * __thiscall wasm::TranslateToFuzzReader::makeTry(TranslateToFuzzReader *this,Type type)

{
  Module *pMVar1;
  Type left;
  bool bVar2;
  Index IVar3;
  uint uVar4;
  Expression *body_00;
  value_type *this_00;
  size_type sVar5;
  size_type sVar6;
  reference pvVar7;
  Tag *this_01;
  Block *right;
  Try *pTVar8;
  optional<wasm::Type> type_00;
  optional<wasm::Type> type_01;
  Name NVar9;
  undefined1 local_158 [2] [12];
  undefined1 local_140 [12];
  uintptr_t local_130;
  Block *local_128;
  Expression *catchBody;
  Index local_114;
  uintptr_t uStack_110;
  Index index;
  Expression *local_108;
  Pop *pop;
  char *local_f8;
  char *pcStack_f0;
  Type local_e0;
  Type tagType;
  Expression *prefix;
  Index i_1;
  Index numCatches;
  pointer local_b8;
  Tag *tag;
  undefined1 local_a8 [4];
  Index i;
  unordered_set<wasm::Tag_*,_std::hash<wasm::Tag_*>,_std::equal_to<wasm::Tag_*>,_std::allocator<wasm::Tag_*>_>
  usedTags;
  undefined1 local_58 [4];
  Index numTags;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> catchBodies;
  vector<wasm::Name,_std::allocator<wasm::Name>_> catchTags;
  Expression *body;
  TranslateToFuzzReader *this_local;
  Type type_local;
  
  body_00 = make(this,type);
  std::vector<wasm::Name,_std::allocator<wasm::Name>_>::vector
            ((vector<wasm::Name,_std::allocator<wasm::Name>_> *)
             &catchBodies.
              super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
            ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)local_58);
  IVar3 = upTo(this,(this->fuzzParams->super_FuzzParams).MAX_TRY_CATCHES);
  std::
  unordered_set<wasm::Tag_*,_std::hash<wasm::Tag_*>,_std::equal_to<wasm::Tag_*>,_std::allocator<wasm::Tag_*>_>
  ::unordered_set((unordered_set<wasm::Tag_*,_std::hash<wasm::Tag_*>,_std::equal_to<wasm::Tag_*>,_std::allocator<wasm::Tag_*>_>
                   *)local_a8);
  for (tag._4_4_ = 0; tag._4_4_ < IVar3; tag._4_4_ = tag._4_4_ + 1) {
    bVar2 = std::
            vector<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
            ::empty(&this->wasm->tags);
    if (bVar2) {
      addTag(this);
    }
    this_00 = pick<std::vector<std::unique_ptr<wasm::Tag,std::default_delete<wasm::Tag>>,std::allocator<std::unique_ptr<wasm::Tag,std::default_delete<wasm::Tag>>>>>
                        (this,&this->wasm->tags);
    local_b8 = std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>::get(this_00);
    sVar5 = std::
            unordered_set<wasm::Tag_*,_std::hash<wasm::Tag_*>,_std::equal_to<wasm::Tag_*>,_std::allocator<wasm::Tag_*>_>
            ::count((unordered_set<wasm::Tag_*,_std::hash<wasm::Tag_*>,_std::equal_to<wasm::Tag_*>,_std::allocator<wasm::Tag_*>_>
                     *)local_a8,&local_b8);
    if (sVar5 == 0) {
      std::
      unordered_set<wasm::Tag_*,_std::hash<wasm::Tag_*>,_std::equal_to<wasm::Tag_*>,_std::allocator<wasm::Tag_*>_>
      ::insert((unordered_set<wasm::Tag_*,_std::hash<wasm::Tag_*>,_std::equal_to<wasm::Tag_*>,_std::allocator<wasm::Tag_*>_>
                *)local_a8,&local_b8);
      std::vector<wasm::Name,_std::allocator<wasm::Name>_>::push_back
                ((vector<wasm::Name,_std::allocator<wasm::Name>_> *)
                 &catchBodies.
                  super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,(value_type *)local_b8);
    }
  }
  sVar6 = std::vector<wasm::Name,_std::allocator<wasm::Name>_>::size
                    ((vector<wasm::Name,_std::allocator<wasm::Name>_> *)
                     &catchBodies.
                      super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
  uVar4 = (uint)sVar6;
  if ((uVar4 == 0) || (bVar2 = oneIn(this,2), prefix._4_4_ = uVar4, bVar2)) {
    prefix._4_4_ = uVar4 + 1;
  }
  for (prefix._0_4_ = 0; (uint)prefix < prefix._4_4_; prefix._0_4_ = (uint)prefix + 1) {
    tagType.id = 0;
    if ((uint)prefix < uVar4) {
      pMVar1 = this->wasm;
      pvVar7 = std::vector<wasm::Name,_std::allocator<wasm::Name>_>::operator[]
                         ((vector<wasm::Name,_std::allocator<wasm::Name>_> *)
                          &catchBodies.
                           super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)(uint)prefix);
      local_f8 = (char *)(pvVar7->super_IString).str._M_len;
      pcStack_f0 = (pvVar7->super_IString).str._M_str;
      NVar9.super_IString.str._M_str = local_f8;
      NVar9.super_IString.str._M_len = (size_t)pMVar1;
      this_01 = (Tag *)::wasm::Module::getTag(NVar9);
      local_e0 = Tag::params(this_01);
      pop._4_4_ = 0;
      bVar2 = Type::operator!=(&local_e0,(BasicType *)((long)&pop + 4));
      if (bVar2) {
        uStack_110 = local_e0.id;
        local_108 = (Expression *)Builder::makePop(&this->builder,local_e0);
        catchBody = (Expression *)local_e0.id;
        local_114 = Builder::addVar(this->funcContext->func,local_e0);
        tagType.id = (uintptr_t)Builder::makeLocalSet(&this->builder,local_114,local_108);
      }
    }
    local_130 = type.id;
    right = (Block *)make(this,type);
    left = tagType;
    local_128 = right;
    if (tagType.id != 0) {
      std::optional<wasm::Type>::optional((optional<wasm::Type> *)local_140);
      type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._12_4_ = 0;
      type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._M_payload =
           (_Storage<wasm::Type,_true>)local_140._0_8_;
      type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._M_engaged = (bool)local_140[8];
      type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._9_3_ = local_140._9_3_;
      local_128 = Builder::makeSequence
                            (&this->builder,(Expression *)left.id,(Expression *)right,type_00);
    }
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)local_58,
               (value_type *)&local_128);
  }
  std::optional<wasm::Type>::optional((optional<wasm::Type> *)local_158);
  type_01.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._12_4_ = 0;
  type_01.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._M_payload =
       (_Storage<wasm::Type,_true>)local_158[0]._0_8_;
  type_01.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._M_engaged = (bool)local_158[0][8];
  type_01.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._9_3_ = local_158[0]._9_3_;
  pTVar8 = Builder::makeTry(&this->builder,body_00,
                            (vector<wasm::Name,_std::allocator<wasm::Name>_> *)
                            &catchBodies.
                             super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,
                            (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                            local_58,type_01);
  std::
  unordered_set<wasm::Tag_*,_std::hash<wasm::Tag_*>,_std::equal_to<wasm::Tag_*>,_std::allocator<wasm::Tag_*>_>
  ::~unordered_set((unordered_set<wasm::Tag_*,_std::hash<wasm::Tag_*>,_std::equal_to<wasm::Tag_*>,_std::allocator<wasm::Tag_*>_>
                    *)local_a8);
  std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~vector
            ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)local_58);
  std::vector<wasm::Name,_std::allocator<wasm::Name>_>::~vector
            ((vector<wasm::Name,_std::allocator<wasm::Name>_> *)
             &catchBodies.
              super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return (Expression *)pTVar8;
}

Assistant:

Expression* TranslateToFuzzReader::makeTry(Type type) {
  auto* body = make(type);
  std::vector<Name> catchTags;
  std::vector<Expression*> catchBodies;
  auto numTags = upTo(fuzzParams->MAX_TRY_CATCHES);
  std::unordered_set<Tag*> usedTags;
  for (Index i = 0; i < numTags; i++) {
    if (wasm.tags.empty()) {
      addTag();
    }
    auto* tag = pick(wasm.tags).get();
    if (usedTags.count(tag)) {
      continue;
    }
    usedTags.insert(tag);
    catchTags.push_back(tag->name);
  }
  // The number of tags in practice may be fewer than we planned.
  numTags = catchTags.size();
  auto numCatches = numTags;
  if (numTags == 0 || oneIn(2)) {
    // Add a catch-all.
    numCatches++;
  }
  for (Index i = 0; i < numCatches; i++) {
    // Catch bodies (aside from a catch-all) begin with a pop.
    Expression* prefix = nullptr;
    if (i < numTags) {
      auto tagType = wasm.getTag(catchTags[i])->params();
      if (tagType != Type::none) {
        auto* pop = builder.makePop(tagType);
        // Capture the pop in a local, so that it can be used later.
        // TODO: add a good chance for using this particular local in this catch
        // TODO: reuse an existing var if there is one
        auto index = builder.addVar(funcContext->func, tagType);
        prefix = builder.makeLocalSet(index, pop);
      }
    }
    auto* catchBody = make(type);
    if (prefix) {
      catchBody = builder.makeSequence(prefix, catchBody);
    }
    catchBodies.push_back(catchBody);
  }
  // TODO: delegate stuff
  return builder.makeTry(body, catchTags, catchBodies);
}